

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
pbrt::Tokenizer::Tokenizer
          (Tokenizer *this,void *ptr,size_t len,string *filename,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  char *pcVar1;
  string *this_00;
  
  (this->loc).filename._M_len = 0;
  (this->loc).filename._M_str = (char *)0x0;
  (this->loc).line = 1;
  (this->loc).column = 0;
  std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::function
            (&this->errorCallback,errorCallback);
  this->unmapPtr = ptr;
  this->unmapLength = len;
  (this->contents)._M_dataplus._M_p = (pointer)&(this->contents).field_2;
  (this->contents)._M_string_length = 0;
  (this->contents).field_2._M_local_buf[0] = '\0';
  (this->sEscaped)._M_dataplus._M_p = (pointer)&(this->sEscaped).field_2;
  (this->sEscaped)._M_string_length = 0;
  (this->sEscaped).field_2._M_local_buf[0] = '\0';
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00,(string *)filename);
  pcVar1 = *(char **)this_00;
  (this->loc).filename._M_len = *(size_t *)(this_00 + 8);
  (this->loc).filename._M_str = pcVar1;
  (this->loc).line = 1;
  (this->loc).column = 0;
  this->pos = (char *)ptr;
  this->end = (char *)(len + (long)ptr);
  return;
}

Assistant:

Tokenizer::Tokenizer(void *ptr, size_t len, std::string filename,
                     std::function<void(const char *, const FileLoc *)> errorCallback)
    : errorCallback(std::move(errorCallback)), unmapPtr(ptr), unmapLength(len) {
    // This is disgusting and leaks memory, but it ensures that the
    // filename in FileLocs returned by the Tokenizer remain valid even
    // after it has been destroyed.
    loc = FileLoc(*new std::string(filename));
    pos = (const char *)ptr;
    end = pos + len;
}